

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::IGXMLScanner::scanDocTypeDecl(IGXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  short *psVar1;
  DocTypeHandler *pDVar2;
  MemoryManager *pMVar3;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar4;
  Grammar *pGVar5;
  void *pvVar6;
  GrammarResolver *this_02;
  XMLValidator *pXVar7;
  XMLStringPool *pXVar8;
  InputSource *pIVar9;
  bool bVar10;
  XMLCh XVar11;
  XMLCh XVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  XMLBuffer *toFill;
  undefined4 extraout_var;
  DTDElementDecl *this_03;
  ulong uVar17;
  DTDElementDecl *pDVar18;
  undefined4 extraout_var_00;
  XMLCh *pXVar19;
  XMLSize_t XVar20;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DTDGrammar *pDVar21;
  XMLReader *pXVar22;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  XMLEntityDecl *this_04;
  undefined4 extraout_var_06;
  RuntimeException *this_05;
  undefined4 extraout_var_07;
  MemoryManager **ppMVar23;
  byte bVar24;
  byte bVar25;
  size_t sVar26;
  InputSource *pIVar27;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar28;
  char16_t *local_100;
  InputSource *srcUsed;
  bool skippedSomething;
  ArrayJanitor<char16_t> janSysId;
  ArrayJanitor<char16_t> janPubId;
  XMLBufBid bbRootName;
  XMLCh gDTDStr [4];
  int colonPosition;
  DTDScanner dtdScanner;
  XMLCh *pXVar16;
  undefined4 extraout_var_01;
  
  switchGrammar(this,L"[dtd]");
  pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
  if (pDVar2 != (DocTypeHandler *)0x0) {
    (*pDVar2->_vptr_DocTypeHandler[0xc])();
  }
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  ReaderMgr::skipPastSpaces(this_00,&skippedSomething,false);
  if (skippedSomething == false) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    do {
      XVar11 = ReaderMgr::getNextChar(this_00);
      if (XVar11 == L'\0') {
        return;
      }
    } while (XVar11 != L'>');
    return;
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_01);
  bVar10 = (this->super_XMLScanner).fDoNamespaces;
  toFill->fIndex = 0;
  pXVar22 = (this->super_XMLScanner).fReaderMgr.fCurReader;
  if (bVar10 == true) {
    bVar10 = XMLReader::getQName(pXVar22,toFill,&colonPosition);
  }
  else {
    bVar10 = XMLReader::getName(pXVar22,toFill,false);
  }
  if (bVar10 == false) {
    if (toFill->fIndex == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,NoRootElemInDOCTYPE);
    }
    else {
      pXVar19 = toFill->fBuffer;
      pXVar19[toFill->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidRootElemInDOCTYPE,pXVar19,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar11 = ReaderMgr::getNextChar(this_00);
      if (XVar11 == L'\0') break;
    } while (XVar11 != L'>');
    goto LAB_002aa54c;
  }
  pXVar19 = toFill->fBuffer;
  pXVar19[toFill->fIndex] = L'\0';
  pMVar3 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar3->_vptr_MemoryManager[4])(pMVar3,(this->super_XMLScanner).fRootElemName);
  if (pXVar19 == (XMLCh *)0x0) {
    pXVar16 = (XMLCh *)0x0;
  }
  else {
    pMVar3 = (this->super_XMLScanner).fMemoryManager;
    sVar26 = 0;
    do {
      psVar1 = (short *)((long)pXVar19 + sVar26);
      sVar26 = sVar26 + 2;
    } while (*psVar1 != 0);
    iVar13 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar26);
    pXVar16 = (XMLCh *)CONCAT44(extraout_var,iVar13);
    memcpy(pXVar16,pXVar19,sVar26);
  }
  (this->super_XMLScanner).fRootElemName = pXVar16;
  ppMVar23 = &(this->super_XMLScanner).fGrammarPoolMemoryManager;
  if ((this->super_XMLScanner).fUseCachedGrammar != false) {
    ppMVar23 = &(this->super_XMLScanner).fMemoryManager;
  }
  pMVar3 = *ppMVar23;
  this_03 = (DTDElementDecl *)XMemory::operator_new(0x58,pMVar3);
  pXVar19 = toFill->fBuffer;
  pXVar19[toFill->fIndex] = L'\0';
  DTDElementDecl::DTDElementDecl
            (this_03,pXVar19,(this->super_XMLScanner).fEmptyNamespaceId,Any,pMVar3);
  (this_03->super_XMLElementDecl).fCreateReason = AsRootElem;
  (this_03->super_XMLElementDecl).fExternalElement = true;
  if ((this->super_XMLScanner).fUseCachedGrammar == false) {
    pGVar5 = (this->super_XMLScanner).fGrammar;
    (*(pGVar5->super_XSerializable)._vptr_XSerializable[0x11])(pGVar5,this_03,0);
    pDVar18 = (DTDElementDecl *)0x0;
  }
  else {
    pNVar4 = this->fDTDElemNonDeclPool;
    pXVar19 = toFill->fBuffer;
    pXVar19[toFill->fIndex] = L'\0';
    if (pNVar4->fIdCounter == 0) {
      pDVar18 = (DTDElementDecl *)0x0;
    }
    else {
      if ((pXVar19 == (XMLCh *)0x0) || (uVar17 = (ulong)(ushort)*pXVar19, uVar17 == 0)) {
        uVar17 = 0;
      }
      else {
        XVar11 = pXVar19[1];
        if (XVar11 != L'\0') {
          pXVar16 = pXVar19 + 2;
          do {
            uVar17 = (ulong)(ushort)XVar11 + (uVar17 >> 0x18) + uVar17 * 0x26;
            XVar11 = *pXVar16;
            pXVar16 = pXVar16 + 1;
          } while (XVar11 != L'\0');
        }
        uVar17 = uVar17 % (pNVar4->fBucketList).fHashModulus;
      }
      pRVar28 = (pNVar4->fBucketList).fBucketList[uVar17];
      if (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        do {
          bVar10 = StringHasher::equals
                             ((StringHasher *)&(pNVar4->fBucketList).field_0x30,pXVar19,
                              pRVar28->fKey);
          if (bVar10) goto LAB_002a9eb1;
          pRVar28 = pRVar28->fNext;
        } while (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
      }
      pRVar28 = (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0;
LAB_002a9eb1:
      if (pRVar28 == (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        pDVar18 = (DTDElementDecl *)0x0;
      }
      else {
        pDVar18 = pRVar28->fData;
      }
    }
    if (pDVar18 == (DTDElementDecl *)0x0) {
      XVar20 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_03);
      pDVar18 = (DTDElementDecl *)0x0;
    }
    else {
      XVar20 = (pDVar18->super_XMLElementDecl).fId;
      pDVar18 = this_03;
    }
    (this_03->super_XMLElementDecl).fId = XVar20;
  }
  ReaderMgr::skipPastSpaces(this_00);
  bVar10 = ReaderMgr::skippedChar(this_00,L'>');
  if (bVar10) {
    pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
    if (pDVar2 != (DocTypeHandler *)0x0) {
      (*pDVar2->_vptr_DocTypeHandler[4])(pDVar2,this_03,0,0,0,0);
    }
  }
  else {
    if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
       ((this->super_XMLScanner).fValidate == false)) {
      (this->super_XMLScanner).fValidate = true;
    }
    DTDScanner::DTDScanner
              (&dtdScanner,(DTDGrammar *)(this->super_XMLScanner).fGrammar,
               (this->super_XMLScanner).fDocTypeHandler,
               (this->super_XMLScanner).fGrammarPoolMemoryManager,
               (this->super_XMLScanner).fMemoryManager);
    DTDScanner::setScannerInfo(&dtdScanner,&this->super_XMLScanner,this_00,this_01);
    XVar11 = ReaderMgr::peekNextChar(this_00);
    if (XVar11 == L'[') {
      bVar24 = 1;
      bVar25 = 1;
      pXVar19 = (char16_t *)0x0;
      local_100 = (char16_t *)0x0;
LAB_002aa0d3:
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janSysId,pXVar19,(this->super_XMLScanner).fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                (&janPubId,local_100,(this->super_XMLScanner).fMemoryManager);
      if (XVar11 != L'[') {
        ReaderMgr::skipPastSpaces(this_00);
        XVar12 = ReaderMgr::peekNextChar(this_00);
        bVar25 = 1;
        if (XVar12 != L'[') {
          bVar25 = bVar24;
        }
      }
      pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
      if (pDVar2 != (DocTypeHandler *)0x0) {
        (*pDVar2->_vptr_DocTypeHandler[4])
                  (pDVar2,this_03,local_100,pXVar19,(ulong)bVar25,(ulong)(XVar11 != L'['));
      }
      if (bVar25 == 0) {
LAB_002aa1b4:
        bVar10 = ReaderMgr::skippedChar(this_00,L'>');
        if (!bVar10) {
          bVar10 = ReaderMgr::skippedChar(this_00,L']');
          if ((bVar10) && (bVar10 = ReaderMgr::skippedChar(this_00,L'>'), bVar10)) {
            XMLScanner::emitError(&this->super_XMLScanner,ExtraCloseSquare);
          }
          else {
            XMLScanner::emitError(&this->super_XMLScanner,UnterminatedDOCTYPE);
            do {
              XVar12 = ReaderMgr::getNextChar(this_00);
              if (XVar12 == L'>') break;
            } while (XVar12 != L'\0');
          }
        }
        if (XVar11 != L'[') {
          srcUsed = (InputSource *)0x0;
          pIVar27 = (InputSource *)0x0;
          if ((bVar25 == 0) && ((this->super_XMLScanner).fUseCachedGrammar != false)) {
            iVar13 = (*(this->super_XMLScanner).super_XMLBufferFullHandler.
                       _vptr_XMLBufferFullHandler[0x11])(this,pXVar19,local_100);
            pIVar27 = (InputSource *)CONCAT44(extraout_var_02,iVar13);
            srcUsed = pIVar27;
            if (pIVar27 == (InputSource *)0x0) {
              pIVar27 = (InputSource *)0x0;
              goto LAB_002aa303;
            }
            this_02 = (this->super_XMLScanner).fGrammarResolver;
            iVar13 = (*pIVar27->_vptr_InputSource[5])();
            pDVar21 = (DTDGrammar *)
                      GrammarResolver::getGrammar(this_02,(XMLCh *)CONCAT44(extraout_var_03,iVar13))
            ;
            if ((pDVar21 == (DTDGrammar *)0x0) ||
               (iVar13 = (*(pDVar21->super_Grammar).super_XSerializable._vptr_XSerializable[5])
                                   (pDVar21), iVar13 != 0)) goto LAB_002aa303;
            this->fDTDGrammar = pDVar21;
            (this->super_XMLScanner).fGrammar = (Grammar *)pDVar21;
            pXVar7 = (this->super_XMLScanner).fValidator;
            (*pXVar7->_vptr_XMLValidator[0xb])(pXVar7,pDVar21);
            pDVar2 = (this->super_XMLScanner).fDocTypeHandler;
            if (pDVar2 != (DocTypeHandler *)0x0) {
              (*pDVar2->_vptr_DocTypeHandler[0x10])();
              (*((this->super_XMLScanner).fDocTypeHandler)->_vptr_DocTypeHandler[10])();
            }
          }
          else {
LAB_002aa303:
            if (((this->super_XMLScanner).fLoadExternalDTD != false) ||
               ((this->super_XMLScanner).fValidate == true)) {
              XVar20 = (this->super_XMLScanner).fLowWaterMark;
              bVar10 = (this->super_XMLScanner).fCalculateSrcOfs;
              if (srcUsed == (InputSource *)0x0) {
                pXVar22 = ReaderMgr::createReader
                                    (this_00,pXVar19,local_100,false,RefFrom_NonLiteral,Type_General
                                     ,Source_External,&srcUsed,bVar10,XVar20,
                                     (this->super_XMLScanner).fDisableDefaultEntityResolution);
                pIVar9 = srcUsed;
                if (pIVar27 != (InputSource *)0x0) {
                  (*pIVar27->_vptr_InputSource[1])(pIVar27);
                }
              }
              else {
                pXVar22 = ReaderMgr::createReader
                                    (this_00,srcUsed,false,RefFrom_NonLiteral,Type_General,
                                     Source_External,bVar10,XVar20);
                pIVar9 = pIVar27;
              }
              pIVar27 = pIVar9;
              if (pXVar22 == (XMLReader *)0x0) {
                this_05 = (RuntimeException *)__cxa_allocate_exception(0x30);
                if (srcUsed != (InputSource *)0x0) {
                  iVar13 = (*srcUsed->_vptr_InputSource[5])();
                  pXVar19 = (XMLCh *)CONCAT44(extraout_var_07,iVar13);
                }
                RuntimeException::RuntimeException
                          (this_05,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                           ,0x5ed,Gen_CouldNotOpenDTD,pXVar19,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
                           ,(this->super_XMLScanner).fMemoryManager);
                __cxa_throw(this_05,&RuntimeException::typeinfo,XMLException::~XMLException);
              }
              if ((this->super_XMLScanner).fToCacheGrammar == true) {
                pXVar8 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar13 = (*srcUsed->_vptr_InputSource[5])();
                uVar14 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[5])
                                   (pXVar8,CONCAT44(extraout_var_04,iVar13));
                pXVar8 = ((this->super_XMLScanner).fGrammarResolver)->fStringPool;
                iVar13 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[10])
                                   (pXVar8,(ulong)uVar14);
                GrammarResolver::orphanGrammar((this->super_XMLScanner).fGrammarResolver,L"[dtd]");
                iVar15 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable).
                           _vptr_XSerializable[0x16])();
                (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar15) + 0x50))
                          ((long *)CONCAT44(extraout_var_05,iVar15),iVar13);
                GrammarResolver::putGrammar
                          ((this->super_XMLScanner).fGrammarResolver,
                           (this->super_XMLScanner).fGrammar);
              }
              builtin_memcpy(gDTDStr,L"DTD",8);
              this_04 = (XMLEntityDecl *)
                        XMemory::operator_new(0x60,(this->super_XMLScanner).fMemoryManager);
              XMLEntityDecl::XMLEntityDecl(this_04,gDTDStr,(this->super_XMLScanner).fMemoryManager);
              (this_04->super_XSerializable)._vptr_XSerializable =
                   (_func_int **)&PTR__XMLEntityDecl_00414f98;
              *(undefined2 *)&this_04[1].super_XSerializable._vptr_XSerializable = 0;
              *(undefined1 *)((long)&this_04[1].super_XSerializable._vptr_XSerializable + 2) = 0;
              if (this_04->fSystemId != (XMLCh *)0x0) {
                (*this_04->fMemoryManager->_vptr_MemoryManager[4])();
              }
              if (pXVar19 == (char16_t *)0x0) {
                pXVar16 = (XMLCh *)0x0;
              }
              else {
                sVar26 = 0;
                do {
                  psVar1 = (short *)((long)pXVar19 + sVar26);
                  sVar26 = sVar26 + 2;
                } while (*psVar1 != 0);
                iVar13 = (*this_04->fMemoryManager->_vptr_MemoryManager[3])
                                   (this_04->fMemoryManager,sVar26);
                pXVar16 = (XMLCh *)CONCAT44(extraout_var_06,iVar13);
                memcpy(pXVar16,pXVar19,sVar26);
              }
              this_04->fSystemId = pXVar16;
              this_04->fIsExternal = true;
              pXVar22->fThrowAtEnd = true;
              ReaderMgr::pushReaderAdoptEntity(this_00,pXVar22,this_04,true);
              DTDScanner::scanExtSubsetDecl(&dtdScanner,false,true);
            }
            if (pIVar27 == (InputSource *)0x0) goto LAB_002aa51f;
          }
          (*pIVar27->_vptr_InputSource[1])(pIVar27);
        }
      }
      else {
        ReaderMgr::getNextChar(this_00);
        XMLScanner::checkInternalDTD(&this->super_XMLScanner,XVar11 != L'[',pXVar19,local_100);
        bVar10 = DTDScanner::scanInternalSubset(&dtdScanner);
        if (bVar10) {
          XVar20 = ReaderMgr::getReaderDepth(this_00);
          if (1 < XVar20) {
            XMLScanner::emitError(&this->super_XMLScanner,PEPropogated);
            ReaderMgr::cleanStackBackTo(this_00,1);
          }
          ReaderMgr::skipPastSpaces(this_00);
          goto LAB_002aa1b4;
        }
        do {
          XVar11 = ReaderMgr::getNextChar(this_00);
          if (XVar11 == L'\0') break;
        } while (XVar11 != L'>');
      }
LAB_002aa51f:
      ArrayJanitor<char16_t>::~ArrayJanitor(&janPubId);
      ArrayJanitor<char16_t>::~ArrayJanitor(&janSysId);
    }
    else {
      (this->super_XMLScanner).fHasNoDTD = false;
      janSysId.fData = (char16_t *)XMLBufferMgr::bidOnBuffer(this_01);
      janSysId.fMemoryManager = (MemoryManager *)this_01;
      janPubId.fData = (char16_t *)XMLBufferMgr::bidOnBuffer(this_01);
      janPubId.fMemoryManager = (MemoryManager *)this_01;
      bVar10 = DTDScanner::scanId(&dtdScanner,(XMLBuffer *)janSysId.fData,
                                  (XMLBuffer *)janPubId.fData,IDType_External);
      if (bVar10) {
        pvVar6 = *(void **)(janSysId.fData + 0x18);
        *(undefined2 *)((long)pvVar6 + *(long *)janSysId.fData * 2) = 0;
        if (pvVar6 == (void *)0x0) {
          local_100 = (char16_t *)0x0;
        }
        else {
          pMVar3 = (this->super_XMLScanner).fMemoryManager;
          sVar26 = 0;
          do {
            psVar1 = (short *)((long)pvVar6 + sVar26);
            sVar26 = sVar26 + 2;
          } while (*psVar1 != 0);
          iVar13 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar26);
          local_100 = (char16_t *)CONCAT44(extraout_var_00,iVar13);
          memcpy(local_100,pvVar6,sVar26);
        }
        pvVar6 = *(void **)(janPubId.fData + 0x18);
        *(undefined2 *)((long)pvVar6 + *(long *)janPubId.fData * 2) = 0;
        if (pvVar6 == (void *)0x0) {
          pXVar19 = (char16_t *)0x0;
        }
        else {
          pMVar3 = (this->super_XMLScanner).fMemoryManager;
          sVar26 = 0;
          do {
            psVar1 = (short *)((long)pvVar6 + sVar26);
            sVar26 = sVar26 + 2;
          } while (*psVar1 != 0);
          iVar13 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar26);
          pXVar19 = (XMLCh *)CONCAT44(extraout_var_01,iVar13);
          memcpy(pXVar19,pvVar6,sVar26);
        }
      }
      else {
        do {
          XVar12 = ReaderMgr::getNextChar(this_00);
          if (XVar12 == L'\0') break;
        } while (XVar12 != L'>');
        pXVar19 = (char16_t *)0x0;
        local_100 = (char16_t *)0x0;
      }
      XMLBufferMgr::releaseBuffer
                ((XMLBufferMgr *)janPubId.fMemoryManager,(XMLBuffer *)janPubId.fData);
      XMLBufferMgr::releaseBuffer
                ((XMLBufferMgr *)janSysId.fMemoryManager,(XMLBuffer *)janSysId.fData);
      if (bVar10) {
        bVar24 = 0;
        bVar25 = 0;
        goto LAB_002aa0d3;
      }
    }
    DTDScanner::~DTDScanner(&dtdScanner);
  }
  if (pDVar18 != (DTDElementDecl *)0x0) {
    (*(pDVar18->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[1])(pDVar18);
  }
LAB_002aa54c:
  XMLBufferMgr::releaseBuffer(this_01,toFill);
  return;
}

Assistant:

void IGXMLScanner::scanDocTypeDecl()
{
    //  We have a doc type. So, switch the Grammar.
    switchGrammar(XMLUni::fgDTDEntityString);

    if (fDocTypeHandler)
        fDocTypeHandler->resetDocType();

    // There must be some space after DOCTYPE
    bool skippedSomething;
    fReaderMgr.skipPastSpaces(skippedSomething);
    if (!skippedSomething)
    {
        emitError(XMLErrs::ExpectedWhitespace);

        // Just skip the Doctype declaration and return
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Get a buffer for the root element
    XMLBufBid bbRootName(&fBufMgr);

    //  Get a name from the input, which should be the name of the root
    //  element of the upcoming content.
    int  colonPosition;
    bool validName = fDoNamespaces ? fReaderMgr.getQName(bbRootName.getBuffer(), &colonPosition) :
                                     fReaderMgr.getName(bbRootName.getBuffer());
    if (!validName)
    {
        if (bbRootName.isEmpty())
            emitError(XMLErrs::NoRootElemInDOCTYPE);
        else
            emitError(XMLErrs::InvalidRootElemInDOCTYPE, bbRootName.getRawBuffer());
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    //  Store the root element name for later check
    setRootElemName(bbRootName.getRawBuffer());

    //  This element obviously is not going to exist in the element decl
    //  pool yet, but we need to call docTypeDecl. So force it into
    //  the element decl pool, marked as being there because it was in
    //  the DOCTYPE. Later, when its declared, the status will be updated.
    //
    //  Only do this if we are not reusing the validator! If we are reusing,
    //  then look it up instead. It has to exist!
    MemoryManager* const  rootDeclMgr =
        fUseCachedGrammar ? fMemoryManager : fGrammarPoolMemoryManager;

    DTDElementDecl* rootDecl = new (rootDeclMgr) DTDElementDecl
    (
        bbRootName.getRawBuffer()
        , fEmptyNamespaceId
        , DTDElementDecl::Any
        , rootDeclMgr
    );

    Janitor<DTDElementDecl> rootDeclJanitor(rootDecl);
    rootDecl->setCreateReason(DTDElementDecl::AsRootElem);
    rootDecl->setExternalElemDeclaration(true);
    if(!fUseCachedGrammar)
    {
        fGrammar->putElemDecl(rootDecl);
        rootDeclJanitor.release();
    } else
    {
        // attach this to the undeclared element pool so that it gets deleted
        XMLElementDecl* elemDecl = fDTDElemNonDeclPool->getByKey(bbRootName.getRawBuffer());
        if (elemDecl)
        {
            rootDecl->setId(elemDecl->getId());
        }
        else
        {
            rootDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)rootDecl));
            rootDeclJanitor.release();
        }
    }

    // Skip any spaces after the name
    fReaderMgr.skipPastSpaces();

    //  And now if we are looking at a >, then we are done. It is not
    //  required to have an internal or external subset, though why you
    //  would not escapes me.
    if (fReaderMgr.skippedChar(chCloseAngle)) {

        //  If we have a doc type handler and advanced callbacks are enabled,
        //  call the doctype event.
        if (fDocTypeHandler)
            fDocTypeHandler->doctypeDecl(*rootDecl, 0, 0, false);
        return;
    }

    // either internal/external subset
    if (fValScheme == Val_Auto && !fValidate)
        fValidate = true;

    bool    hasIntSubset = false;
    bool    hasExtSubset = false;
    XMLCh*  sysId = 0;
    XMLCh*  pubId = 0;

    DTDScanner dtdScanner
    (
        (DTDGrammar*) fGrammar
        , fDocTypeHandler
        , fGrammarPoolMemoryManager
        , fMemoryManager
    );
    dtdScanner.setScannerInfo(this, &fReaderMgr, &fBufMgr);

    //  If the next character is '[' then we have no external subset cause
    //  there is no system id, just the opening character of the internal
    //  subset. Else, has to be an id.
    //
    // Just look at the next char, don't eat it.
    if (fReaderMgr.peekNextChar() == chOpenSquare)
    {
        hasIntSubset = true;
    }
    else
    {
        // Indicate we have an external subset
        hasExtSubset = true;
        fHasNoDTD = false;

        // Get buffers for the ids
        XMLBufBid bbPubId(&fBufMgr);
        XMLBufBid bbSysId(&fBufMgr);

        // Get the external subset id
        if (!dtdScanner.scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), DTDScanner::IDType_External))
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // Get copies of the ids we got
        pubId = XMLString::replicate(bbPubId.getRawBuffer(), fMemoryManager);
        sysId = XMLString::replicate(bbSysId.getRawBuffer(), fMemoryManager);
    }

    // Insure that the ids get cleaned up, if they got allocated
    ArrayJanitor<XMLCh> janSysId(sysId, fMemoryManager);
    ArrayJanitor<XMLCh> janPubId(pubId, fMemoryManager);

    if (hasExtSubset)
    {
        // Skip spaces and check again for the opening of an internal subset
        fReaderMgr.skipPastSpaces();

        // Just look at the next char, don't eat it.
        if (fReaderMgr.peekNextChar() == chOpenSquare) {
            hasIntSubset = true;
        }
    }

    //  If we have a doc type handler and advanced callbacks are enabled,
    //  call the doctype event.
    if (fDocTypeHandler)
        fDocTypeHandler->doctypeDecl(*rootDecl, pubId, sysId, hasIntSubset, hasExtSubset);

    //  Ok, if we had an internal subset, we are just past the [ character
    //  and need to parse that first.
    if (hasIntSubset)
    {
        // Eat the opening square bracket
        fReaderMgr.getNextChar();

        checkInternalDTD(hasExtSubset, sysId, pubId);

        //  And try to scan the internal subset. If we fail, try to recover
        //  by skipping forward tot he close angle and returning.
        if (!dtdScanner.scanInternalSubset())
        {
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        //  Do a sanity check that some expanded PE did not propogate out of
        //  the doctype. This could happen if it was terminated early by bad
        //  syntax.
        if (fReaderMgr.getReaderDepth() > 1)
        {
            emitError(XMLErrs::PEPropogated);

            // Ask the reader manager to pop back down to the main level
            fReaderMgr.cleanStackBackTo(1);
        }

        fReaderMgr.skipPastSpaces();
    }

    // And that should leave us at the closing > of the DOCTYPE line
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        //  Do a special check for the common scenario of an extra ] char at
        //  the end. This is easy to recover from.
        if (fReaderMgr.skippedChar(chCloseSquare)
        &&  fReaderMgr.skippedChar(chCloseAngle))
        {
            emitError(XMLErrs::ExtraCloseSquare);
        }
         else
        {
            emitError(XMLErrs::UnterminatedDOCTYPE);
            fReaderMgr.skipPastChar(chCloseAngle);
        }
    }

    //  If we had an external subset, then we need to deal with that one
    //  next. If we are reusing the validator, then don't scan it.
    if (hasExtSubset) {

        InputSource* srcUsed=0;
        Janitor<InputSource> janSrc(srcUsed);
        // If we had an internal subset and we're using the cached grammar, it
        // means that the ignoreCachedDTD is set, so we ignore the cached
        // grammar
        if (fUseCachedGrammar && !hasIntSubset)
        {
            srcUsed = resolveSystemId(sysId, pubId);
            if (srcUsed) {
                janSrc.reset(srcUsed);
                Grammar* grammar = fGrammarResolver->getGrammar(srcUsed->getSystemId());

                if (grammar && grammar->getGrammarType() == Grammar::DTDGrammarType) {

                    fDTDGrammar = (DTDGrammar*) grammar;
                    fGrammar = fDTDGrammar;
                    fValidator->setGrammar(fGrammar);
                    // If we don't report at least the external subset boundaries,
                    // an advanced document handler cannot know when the DTD end,
                    // since we've already sent a doctype decl that indicates there's
                    // there's an external subset.
                    if (fDocTypeHandler)
                    {
                        fDocTypeHandler->startExtSubset();
                        fDocTypeHandler->endExtSubset();
                    }

                    return;
                }
            }
        }

        if (fLoadExternalDTD || fValidate)
        {
            // And now create a reader to read this entity
            XMLReader* reader;
            if (srcUsed) {
                reader = fReaderMgr.createReader
                        (
                            *srcUsed
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , fCalculateSrcOfs
                            , fLowWaterMark
                        );
            }
            else {
                reader = fReaderMgr.createReader
                        (
                            sysId
                            , pubId
                            , false
                            , XMLReader::RefFrom_NonLiteral
                            , XMLReader::Type_General
                            , XMLReader::Source_External
                            , srcUsed
                            , fCalculateSrcOfs
                            , fLowWaterMark
                            , fDisableDefaultEntityResolution
                        );
                janSrc.reset(srcUsed);
            }
            //  If it failed then throw an exception
            if (!reader)
                ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Gen_CouldNotOpenDTD, srcUsed ? srcUsed->getSystemId() : sysId, fMemoryManager);

            if (fToCacheGrammar) {

                unsigned int stringId = fGrammarResolver->getStringPool()->addOrFind(srcUsed->getSystemId());
                const XMLCh* sysIdStr = fGrammarResolver->getStringPool()->getValueForId(stringId);

                fGrammarResolver->orphanGrammar(XMLUni::fgDTDEntityString);
                ((XMLDTDDescription*) (fGrammar->getGrammarDescription()))->setSystemId(sysIdStr);
                fGrammarResolver->putGrammar(fGrammar);
            }

            //  In order to make the processing work consistently, we have to
            //  make this look like an external entity. So create an entity
            //  decl and fill it in and push it with the reader, as happens
            //  with an external entity. Put a janitor on it to insure it gets
            //  cleaned up. The reader manager does not adopt them.
            const XMLCh gDTDStr[] = { chLatin_D, chLatin_T, chLatin_D , chNull };
            DTDEntityDecl* declDTD = new (fMemoryManager) DTDEntityDecl(gDTDStr, false, fMemoryManager);
            declDTD->setSystemId(sysId);
            declDTD->setIsExternal(true);

            // Mark this one as a throw at end
            reader->setThrowAtEnd(true);

            // And push it onto the stack, with its pseudo name
            fReaderMgr.pushReaderAdoptEntity(reader, declDTD);

            // Tell it its not in an include section
            dtdScanner.scanExtSubsetDecl(false, true);
        }
    }
}